

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O3

double __thiscall icu_63::Calendar::getTimeInMillis(Calendar *this,UErrorCode *status)

{
  if (U_ZERO_ERROR < *status) {
    return 0.0;
  }
  if (this->fIsTimeSet == '\0') {
    (*(this->super_UObject)._vptr_UObject[0x1c])(this);
    if (U_ZERO_ERROR < *status) {
      return 0.0;
    }
    if ((this->fLenient != '\0') || (this->fAreAllFieldsSet == '\0')) {
      this->fAreFieldsSet = '\0';
    }
    this->fIsTimeSet = '\x01';
    this->fAreFieldsVirtuallySet = '\0';
  }
  return this->fTime;
}

Assistant:

double
Calendar::getTimeInMillis(UErrorCode& status) const
{
    if(U_FAILURE(status))
        return 0.0;

    if ( ! fIsTimeSet)
        ((Calendar*)this)->updateTime(status);

    /* Test for buffer overflows */
    if(U_FAILURE(status)) {
        return 0.0;
    }
    return fTime;
}